

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCubicSpline.cpp
# Opt level: O3

void __thiscall
chrono::ChCubicSpline::Evaluate(ChCubicSpline *this,double t,double *y,double *yp,double *ypp)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  double dVar6;
  double dVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  if (this->m_process == true) {
    Process(this);
  }
  pdVar3 = (this->m_t).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar12 = *pdVar3;
  if (t < dVar12) {
    __assert_fail("t >= m_t[0]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/core/ChCubicSpline.cpp"
                  ,0x85,"void chrono::ChCubicSpline::Evaluate(double, double &, double &, double &)"
                 );
  }
  lVar9 = (long)(this->m_t).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar3;
  if (*(double *)((long)pdVar3 + lVar9 + -8) < t) {
    __assert_fail("t <= m_t[n - 1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/core/ChCubicSpline.cpp"
                  ,0x86,"void chrono::ChCubicSpline::Evaluate(double, double &, double &, double &)"
                 );
  }
  uVar10 = lVar9 >> 3;
  uVar8 = 0;
  if (1 < uVar10) {
    uVar8 = (int)uVar10 - 1;
    lVar9 = 0;
    do {
      if (t <= pdVar3[lVar9 + 1]) {
        uVar8 = (uint)lVar9;
        break;
      }
      lVar9 = lVar9 + 1;
    } while (uVar10 - 1 != lVar9);
    dVar12 = pdVar3[uVar8];
  }
  pdVar4 = (this->m_ypp).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (ulong)uVar8;
  pdVar5 = (this->m_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pdVar4[uVar10];
  dVar2 = pdVar5[uVar10];
  dVar7 = pdVar3[uVar10 + 1] - dVar12;
  dVar6 = dVar7 * dVar7;
  auVar11._0_8_ = (t - dVar12) / dVar7;
  auVar11._8_8_ = 0;
  dVar12 = dVar6 * dVar1 * 0.5;
  dVar14 = (dVar6 * (pdVar4[uVar10 + 1] - dVar1)) / 6.0;
  dVar1 = ((pdVar5[uVar10 + 1] - dVar2) - dVar14) - dVar12;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = auVar11._0_8_ * dVar14 * auVar11._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar11._0_8_ * dVar12 * auVar11._0_8_;
  auVar13 = vfmadd231sd_fma(auVar20,auVar11,auVar18);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar1;
  auVar13 = vfmadd231sd_fma(auVar13,auVar17,auVar11);
  *y = auVar13._0_8_ + dVar2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar12 + dVar12;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar14 * 6.0;
  auVar13 = vfmadd213sd_fma(auVar15,auVar11,auVar13);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = auVar11._0_8_ * dVar14 * 3.0;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = auVar11._0_8_ * (dVar12 + dVar12);
  auVar11 = vfmadd231sd_fma(auVar19,auVar11,auVar16);
  *yp = (auVar11._0_8_ + dVar1) / dVar7;
  *ypp = auVar13._0_8_ / dVar6;
  return;
}

Assistant:

void ChCubicSpline::Evaluate(double t, double& y, double& yp, double& ypp) {
    if (m_process)
        Process();

    auto n = m_t.size();
    assert(t >= m_t[0]);
    assert(t <= m_t[n - 1]);

    // Bracket the given value: m_t[i_left] < t <= m_t[i_left+1]
    int left = 0;
    for (size_t i = 1; i < n; i++) {
        if (t > m_t[i])
            left++;
        else
            break;
    }

    double dt = m_t[left + 1] - m_t[left];
    double tau = (t - m_t[left]) / dt;
    double a = dt * dt * (m_ypp[left + 1] - m_ypp[left]) / 6;
    double b = dt * dt * m_ypp[left] / 2;
    double c = (m_y[left + 1] - m_y[left]) - a - b;
    double d = m_y[left];

    y = a * tau * tau * tau + b * tau * tau + c * tau + d;
    yp = (3 * a * tau * tau + 2 * b * tau + c) / dt;
    ypp = (6 * a * tau + 2 * b) / (dt * dt);
}